

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::reduceDB_Tier2(Solver *this)

{
  uint64_t *puVar1;
  ulong *puVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  lbool *plVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  int iVar17;
  long lVar18;
  float fVar19;
  
  reset_old_trail(this);
  sort<unsigned_int,reduceDB_tch>
            ((this->learnts_tier2).data,(this->learnts_tier2).sz,(reduceDB_tch)&this->ca);
  iVar9 = (this->learnts_tier2).sz;
  if (iVar9 < 1) {
    iVar17 = 0;
  }
  else {
    iVar13 = (this->learnts_tier2).sz / 2;
    lVar18 = 0;
    iVar17 = 0;
    do {
      puVar6 = (this->learnts_tier2).data;
      uVar4 = puVar6[lVar18];
      puVar7 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar10 = *(ulong *)(puVar7 + uVar4);
      if (((uint)uVar10 & 3) == 2) {
        puVar2 = (ulong *)(puVar7 + uVar4);
        if ((uVar10 & 0xfffffffc00000000) == 0x800000000) {
          uVar10 = (ulong)((this->assigns).data[(int)puVar2[1] >> 1].value !=
                          ((byte)(int)puVar2[1] & 1));
        }
        else {
          uVar10 = 0;
        }
        iVar9 = *(int *)((long)puVar2 + uVar10 * 4 + 8);
        iVar14 = iVar9 >> 1;
        plVar8 = (this->assigns).data;
        bVar16 = true;
        if (plVar8[iVar14].value == ((byte)iVar9 & 1)) {
          uVar12 = (this->vardata).data[iVar14].reason;
          bVar16 = uVar12 != uVar4 || uVar12 == 0xffffffff;
        }
        if ((bVar16) && (lVar18 < iVar13)) {
          vec<unsigned_int>::push(&this->learnts_local,puVar6 + lVar18);
          uVar10 = *puVar2;
          *puVar2 = uVar10 & 0xfffffffffffffffc;
          uVar10 = uVar10 >> 0x22;
          *(undefined4 *)((long)puVar2 + uVar10 * 4 + 8) = 0;
          *(int *)((long)puVar2 + uVar10 * 4 + 0xc) = (int)this->conflicts;
          dVar3 = this->cla_inc;
          fVar19 = (float)(dVar3 + 0.0);
          *(float *)((long)puVar2 + uVar10 * 4 + 8) = fVar19;
          if (1e+20 < fVar19) {
            lVar11 = (long)(this->learnts_local).sz;
            if (0 < lVar11) {
              puVar6 = (this->learnts_local).data;
              puVar7 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
              lVar15 = 0;
              do {
                puVar2 = (ulong *)(puVar7 + puVar6[lVar15]);
                *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) =
                     *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) * 1e-20;
                lVar15 = lVar15 + 1;
              } while (lVar11 != lVar15);
            }
            this->cla_inc = dVar3 * 1e-20;
          }
        }
        else {
          puVar6[iVar17] = uVar4;
          if ((*puVar2 & 0xfffffffc00000000) == 0x800000000) {
            iVar9 = (int)puVar2[1];
            uVar10 = (ulong)(plVar8[iVar9 >> 1].value != ((byte)iVar9 & 1));
          }
          else {
            uVar10 = 0;
          }
          iVar9 = *(int *)((long)(puVar2 + 1) + uVar10 * 4);
          iVar14 = iVar9 >> 1;
          uVar12 = 0;
          if ((plVar8[iVar14].value == ((byte)iVar9 & 1)) &&
             (uVar5 = (this->vardata).data[iVar14].reason, uVar5 != 0xffffffff)) {
            uVar12 = (uint)(uVar5 == uVar4);
          }
          iVar17 = iVar17 + 1;
          iVar13 = iVar13 + uVar12;
        }
      }
      lVar18 = lVar18 + 1;
      iVar9 = (this->learnts_tier2).sz;
    } while (lVar18 < iVar9);
    iVar17 = (int)lVar18 - iVar17;
  }
  if (0 < iVar17) {
    (this->learnts_tier2).sz = iVar9 - iVar17;
  }
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + (long)(this->learnts_tier2).sz;
  return;
}

Assistant:

void Solver::reduceDB_Tier2()
{
    TRACE(std::cout << "c run reduceDB_tier2 on level " << decisionLevel() << std::endl);
    reset_old_trail();
    int i, j;
    sort(learnts_tier2, reduceDB_tch(ca));
    int limit = learnts_tier2.size() / 2;

    for (i = j = 0; i < learnts_tier2.size(); i++) {
        Clause &c = ca[learnts_tier2[i]];
        if (c.mark() == TIER2) {
            if (!locked(c) && i < limit) {
                learnts_local.push(learnts_tier2[i]);
                c.mark(LOCAL);
                // c.removable(true);
                c.activity() = 0;
                c.touched() = conflicts;
                claBumpActivity(c);
            } else {
                learnts_tier2[j++] = learnts_tier2[i];
                if (locked(c)) {
                    limit++;
                }
            }
        }
    }
    learnts_tier2.shrink(i - j);
    statistics.solveSteps += learnts_tier2.size();
    TRACE(std::cout << "c done running reduceDB_tier2 on level " << decisionLevel() << std::endl);
}